

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj.c
# Opt level: O2

void Maj_ManPrintSolution(Maj_Man_t *p)

{
  uint uVar1;
  int k;
  int iVar2;
  char *__format;
  
  printf("Realization of %d-input majority using %d MAJ3 gates:\n",(ulong)(uint)p->nVars,
         (ulong)(uint)p->nNodes);
  iVar2 = p->nObjs;
  while (p->nVars + 2 < iVar2) {
    printf("%02d = MAJ(",(ulong)(iVar2 - 3));
    for (k = 2; -1 < k; k = k + -1) {
      uVar1 = Maj_ManFindFanin(p,iVar2 + -1,k);
      if ((int)uVar1 < 2) {
        __format = " %d";
      }
      else if ((int)uVar1 < p->nVars + 2) {
        uVar1 = uVar1 + 0x5f;
        __format = " %c";
      }
      else {
        uVar1 = uVar1 - 2;
        __format = " %02d";
      }
      printf(__format,(ulong)uVar1);
    }
    puts(" )");
    iVar2 = iVar2 + -1;
  }
  return;
}

Assistant:

void Maj_ManPrintSolution( Maj_Man_t * p )
{
    int i, k, iVar;
    printf( "Realization of %d-input majority using %d MAJ3 gates:\n", p->nVars, p->nNodes );
//    for ( i = p->nVars + 2; i < p->nObjs; i++ )
    for ( i = p->nObjs - 1; i >= p->nVars + 2; i-- )
    {
        printf( "%02d = MAJ(", i-2 );
        for ( k = 2; k >= 0; k-- )
        {
            iVar = Maj_ManFindFanin( p, i, k );
            if ( iVar >= 2 && iVar < p->nVars + 2 )
                printf( " %c", 'a'+iVar-2 );
            else if ( iVar < 2 )
                printf( " %d", iVar );
            else
                printf( " %02d", iVar-2 );
        }
        printf( " )\n" );
    }
}